

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_set.h
# Opt level: O2

InsertResult __thiscall
wasm::UnorderedFixedStorage<wasm::LocalSet_*,_2UL>::insert
          (UnorderedFixedStorage<wasm::LocalSet_*,_2UL> *this,LocalSet **x)

{
  LocalSet **ppLVar1;
  ulong uVar2;
  LocalSet *pLVar3;
  ulong uVar4;
  
  uVar2 = (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).used;
  pLVar3 = *x;
  uVar4 = 0;
  while (uVar2 != uVar4) {
    ppLVar1 = (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage._M_elems + uVar4;
    uVar4 = uVar4 + 1;
    if (*ppLVar1 == pLVar3) {
      return NoError;
    }
  }
  if (2 < uVar2) {
    __assert_fail("this->used <= N",
                  "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/support/small_set.h"
                  ,0x3e,
                  "InsertResult wasm::UnorderedFixedStorage<wasm::LocalSet *, 2>::insert(const T &) [T = wasm::LocalSet *, N = 2]"
                 );
  }
  if (uVar2 != 2) {
    (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).used = uVar2 + 1;
    (this->super_FixedStorageBase<wasm::LocalSet_*,_2UL>).storage._M_elems[uVar2] = pLVar3;
    return NoError;
  }
  return CouldNotInsert;
}

Assistant:

InsertResult insert(const T& x) {
    for (size_t i = 0; i < this->used; i++) {
      if (this->storage[i] == x) {
        return InsertResult::NoError;
      }
    }
    assert(this->used <= N);
    if (this->used == N) {
      return InsertResult::CouldNotInsert;
    }
    this->storage[this->used++] = x;
    return InsertResult::NoError;
  }